

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_column_reader.cpp
# Opt level: O1

void duckdb::StringColumnReader::ReferenceBlock
               (Vector *result,shared_ptr<duckdb::ResizeableBuffer,_true> *block)

{
  buffer_ptr<duckdb::ParquetStringVectorBuffer> bVar1;
  undefined8 local_38;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_30;
  undefined8 local_28;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_20;
  
  bVar1 = make_buffer<duckdb::ParquetStringVectorBuffer,duckdb::shared_ptr<duckdb::ResizeableBuffer,true>&>
                    ((duckdb *)&local_38,block);
  local_28 = local_38;
  p_Stack_20 = p_Stack_30;
  local_38 = 0;
  p_Stack_30 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  duckdb::StringVector::AddBuffer
            (result,&local_28,
             bVar1.internal.
             super___shared_ptr<duckdb::ParquetStringVectorBuffer,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi);
  if (p_Stack_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_20);
  }
  if (p_Stack_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_30);
  }
  return;
}

Assistant:

void StringColumnReader::ReferenceBlock(Vector &result, shared_ptr<ResizeableBuffer> &block) {
	StringVector::AddBuffer(result, make_buffer<ParquetStringVectorBuffer>(block));
}